

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

SquareMatrix<2> pbrt::operator*(SquareMatrix<2> *m1,SquareMatrix<2> *m2)

{
  float *pfVar1;
  float fVar2;
  int k;
  int j;
  int i;
  SquareMatrix<2> r;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  span<float> local_80;
  span<float> local_70;
  span<const_float> local_60;
  span<const_float> local_50;
  int local_3c;
  span<float> local_38;
  int local_28;
  int local_24;
  SquareMatrix<2> local_10;
  
  SquareMatrix<2>::SquareMatrix(&local_10);
  for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
      local_38 = SquareMatrix<2>::operator[]
                           ((SquareMatrix<2> *)
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            (int)in_stack_ffffffffffffff6c);
      pfVar1 = pstd::span<float>::operator[](&local_38,(long)local_28);
      *pfVar1 = 0.0;
      local_3c = 0;
      while( true ) {
        if (1 < local_3c) break;
        local_50 = SquareMatrix<2>::operator[]
                             ((SquareMatrix<2> *)
                              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              (int)in_stack_ffffffffffffff6c);
        pfVar1 = pstd::span<const_float>::operator[](&local_50,(long)local_3c);
        in_stack_ffffffffffffff74 = *pfVar1;
        local_60 = SquareMatrix<2>::operator[]
                             ((SquareMatrix<2> *)
                              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              (int)in_stack_ffffffffffffff6c);
        pstd::span<const_float>::operator[](&local_60,(long)local_28);
        local_70 = SquareMatrix<2>::operator[]
                             ((SquareMatrix<2> *)
                              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              (int)in_stack_ffffffffffffff6c);
        pstd::span<float>::operator[](&local_70,(long)local_28);
        fVar2 = FMA(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        local_80 = SquareMatrix<2>::operator[]
                             ((SquareMatrix<2> *)
                              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              (int)in_stack_ffffffffffffff6c);
        pfVar1 = pstd::span<float>::operator[](&local_80,(long)local_28);
        *pfVar1 = fVar2;
        local_3c = local_3c + 1;
      }
    }
  }
  return (SquareMatrix<2>)local_10.m;
}

Assistant:

PBRT_CPU_GPU inline SquareMatrix<N> operator*(const SquareMatrix<N> &m1,
                                              const SquareMatrix<N> &m2) {
    SquareMatrix<N> r;
    for (int i = 0; i < N; ++i)
        for (int j = 0; j < N; ++j) {
            r[i][j] = 0;
            for (int k = 0; k < N; ++k)
                r[i][j] = FMA(m1[i][k], m2[k][j], r[i][j]);
        }
    return r;
}